

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

QModelIndexList * __thiscall
QItemSelection::indexes(QModelIndexList *__return_storage_ptr__,QItemSelection *this)

{
  QItemSelectionRange *range;
  QItemSelectionRange *range_00;
  long lVar1;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (this->super_QList<QItemSelectionRange>).d.size;
  if (lVar1 != 0) {
    range_00 = (this->super_QList<QItemSelectionRange>).d.ptr;
    lVar1 = lVar1 << 4;
    do {
      indexesFromRange<QList<QModelIndex>>(range_00,__return_storage_ptr__);
      range_00 = range_00 + 1;
      lVar1 = lVar1 + -0x10;
    } while (lVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QItemSelection::indexes() const
{
    return qSelectionIndexes<QModelIndexList>(*this);
}